

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall CGraphics_Threaded::InitWindow(CGraphics_Threaded *this)

{
  int iVar1;
  long in_RDI;
  CGraphics_Threaded *in_stack_00000018;
  
  iVar1 = IssueInit(in_stack_00000018);
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    if (*(int *)(*(long *)(in_RDI + 0x90) + 0xec8) == 0) break;
    *(int *)(*(long *)(in_RDI + 0x90) + 0xec8) = *(int *)(*(long *)(in_RDI + 0x90) + 0xec8) + -1;
    if (*(int *)(*(long *)(in_RDI + 0x90) + 0xec8) == 0) {
      dbg_msg("gfx","disabling FSAA and trying again");
    }
    else {
      dbg_msg("gfx","lowering FSAA to %d and trying again",
              (ulong)*(uint *)(*(long *)(in_RDI + 0x90) + 0xec8));
    }
    iVar1 = IssueInit(in_stack_00000018);
  }
  if ((*(int *)(*(long *)(in_RDI + 0x90) + 0xe9c) != 0x280) ||
     (*(int *)(*(long *)(in_RDI + 0x90) + 0xea0) != 0x1e0)) {
    dbg_msg("gfx","setting resolution to 640x480 and trying again");
    *(undefined4 *)(*(long *)(in_RDI + 0x90) + 0xe9c) = 0x280;
    *(undefined4 *)(*(long *)(in_RDI + 0x90) + 0xea0) = 0x1e0;
    iVar1 = IssueInit(in_stack_00000018);
    if (iVar1 == 0) {
      return 0;
    }
  }
  dbg_msg("gfx","out of ideas. failed to init graphics");
  return -1;
}

Assistant:

int CGraphics_Threaded::InitWindow()
{
	if(IssueInit() == 0)
		return 0;

	// try disabling fsaa
	while(m_pConfig->m_GfxFsaaSamples)
	{
		m_pConfig->m_GfxFsaaSamples--;

		if(m_pConfig->m_GfxFsaaSamples)
			dbg_msg("gfx", "lowering FSAA to %d and trying again", m_pConfig->m_GfxFsaaSamples);
		else
			dbg_msg("gfx", "disabling FSAA and trying again");

		if(IssueInit() == 0)
			return 0;
	}

	// try lowering the resolution
	if(m_pConfig->m_GfxScreenWidth != 640 || m_pConfig->m_GfxScreenHeight != 480)
	{
		dbg_msg("gfx", "setting resolution to 640x480 and trying again");
		m_pConfig->m_GfxScreenWidth = 640;
		m_pConfig->m_GfxScreenHeight = 480;

		if(IssueInit() == 0)
			return 0;
	}

	dbg_msg("gfx", "out of ideas. failed to init graphics");

	return -1;
}